

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

bool __thiscall cmCTestTestHandler::GetListOfTests(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  char *pcVar5;
  string *psVar6;
  cmState *pcVar7;
  string local_23c8 [32];
  undefined1 local_23a8 [8];
  ostringstream cmCTestLog_msg_1;
  optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2230;
  optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_21f8;
  allocator<char> local_21b9;
  string local_21b8;
  cmValue local_2198;
  cmValue specFile;
  string local_2188;
  undefined4 local_2164;
  char *local_2160;
  char *testFilename;
  Command local_2148;
  allocator<char> local_2121;
  string local_2120;
  allocator<char> local_20f9;
  string local_20f8;
  cmCTestSetTestsPropertiesCommand local_20d8;
  Command local_20c8;
  allocator<char> local_20a1;
  string local_20a0;
  allocator<char> local_2079;
  string local_2078;
  allocator<char> local_2051;
  string local_2050;
  cmCTestAddTestCommand local_2030;
  Command local_2020;
  allocator<char> local_1ff9;
  string local_1ff8;
  string_view local_1fd8;
  allocator<char> local_1fc1;
  string local_1fc0;
  cmStateSnapshot local_1fa0;
  undefined1 local_1f88 [8];
  cmMakefile mf;
  cmGlobalGenerator gg;
  allocator<char> local_ab1;
  string local_ab0;
  allocator<char> local_a89;
  string local_a88;
  undefined1 local_a68 [8];
  cmake cm;
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmCTestTestHandler *this_local;
  
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmsys::RegularExpression::compile(&this->IncludeTestsRegularExpression,&this->IncludeRegExp);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmsys::RegularExpression::compile(&this->ExcludeTestsRegularExpression,&this->ExcludeRegExp);
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar4 = std::operator<<((ostream *)local_190,"Constructing a list of tests");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x712,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string((string *)&cm.ScriptModeExitCode);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  cmake::cmake((cmake *)local_a68,RoleScript,CTest,Normal);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a88,"",&local_a89);
  cmake::SetHomeDirectory((cmake *)local_a68,&local_a88);
  std::__cxx11::string::~string((string *)&local_a88);
  std::allocator<char>::~allocator(&local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ab0,"",&local_ab1);
  cmake::SetHomeOutputDirectory((cmake *)local_a68,&local_ab0);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::allocator<char>::~allocator(&local_ab1);
  cmake::GetCurrentSnapshot((cmStateSnapshot *)&gg.InstallTargetEnabled,(cmake *)local_a68);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&gg.InstallTargetEnabled);
  cmGlobalGenerator::cmGlobalGenerator
            ((cmGlobalGenerator *)&mf.IsSourceFileTryCompile,(cmake *)local_a68);
  cmake::GetCurrentSnapshot(&local_1fa0,(cmake *)local_a68);
  cmMakefile::cmMakefile
            ((cmMakefile *)local_1f88,(cmGlobalGenerator *)&mf.IsSourceFileTryCompile,&local_1fa0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1fc0,"CTEST_CONFIGURATION_TYPE",&local_1fc1);
  psVar6 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  local_1fd8 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
  cmMakefile::AddDefinition((cmMakefile *)local_1f88,&local_1fc0,local_1fd8);
  std::__cxx11::string::~string((string *)&local_1fc0);
  std::allocator<char>::~allocator(&local_1fc1);
  pcVar7 = cmake::GetState((cmake *)local_a68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ff8,"add_test",&local_1ff9);
  anon_unknown.dwarf_7b1da::cmCTestAddTestCommand::cmCTestCommand(&local_2030,this);
  std::
  function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
  ::function<(anonymous_namespace)::cmCTestAddTestCommand,void>
            ((function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
              *)&local_2020,&local_2030);
  cmState::AddBuiltinCommand(pcVar7,&local_1ff8,&local_2020);
  std::
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  ::~function(&local_2020);
  anon_unknown.dwarf_7b1da::cmCTestAddTestCommand::~cmCTestAddTestCommand(&local_2030);
  std::__cxx11::string::~string((string *)&local_1ff8);
  std::allocator<char>::~allocator(&local_1ff9);
  pcVar7 = cmake::GetState((cmake *)local_a68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2050,"subdirs",&local_2051);
  cmState::AddBuiltinCommand(pcVar7,&local_2050,anon_unknown.dwarf_7b1da::cmCTestSubdirCommand);
  std::__cxx11::string::~string((string *)&local_2050);
  std::allocator<char>::~allocator(&local_2051);
  pcVar7 = cmake::GetState((cmake *)local_a68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2078,"add_subdirectory",&local_2079);
  cmState::AddBuiltinCommand
            (pcVar7,&local_2078,anon_unknown.dwarf_7b1da::cmCTestAddSubdirectoryCommand);
  std::__cxx11::string::~string((string *)&local_2078);
  std::allocator<char>::~allocator(&local_2079);
  pcVar7 = cmake::GetState((cmake *)local_a68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_20a0,"set_tests_properties",&local_20a1);
  anon_unknown.dwarf_7b1da::cmCTestSetTestsPropertiesCommand::cmCTestCommand(&local_20d8,this);
  std::
  function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
  ::function<(anonymous_namespace)::cmCTestSetTestsPropertiesCommand,void>
            ((function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
              *)&local_20c8,&local_20d8);
  cmState::AddBuiltinCommand(pcVar7,&local_20a0,&local_20c8);
  std::
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  ::~function(&local_20c8);
  anon_unknown.dwarf_7b1da::cmCTestSetTestsPropertiesCommand::~cmCTestSetTestsPropertiesCommand
            (&local_20d8);
  std::__cxx11::string::~string((string *)&local_20a0);
  std::allocator<char>::~allocator(&local_20a1);
  pcVar7 = cmake::GetState((cmake *)local_a68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_20f8,"set_directory_properties",&local_20f9);
  cmState::RemoveBuiltinCommand(pcVar7,&local_20f8);
  std::__cxx11::string::~string((string *)&local_20f8);
  std::allocator<char>::~allocator(&local_20f9);
  pcVar7 = cmake::GetState((cmake *)local_a68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2120,"set_directory_properties",&local_2121);
  anon_unknown.dwarf_7b1da::cmCTestSetDirectoryPropertiesCommand::cmCTestCommand
            ((cmCTestSetDirectoryPropertiesCommand *)&testFilename,this);
  std::
  function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
  ::function<(anonymous_namespace)::cmCTestSetDirectoryPropertiesCommand,void>
            ((function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>
              *)&local_2148,(cmCTestSetDirectoryPropertiesCommand *)&testFilename);
  cmState::AddBuiltinCommand(pcVar7,&local_2120,&local_2148);
  std::
  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
  ::~function(&local_2148);
  anon_unknown.dwarf_7b1da::cmCTestSetDirectoryPropertiesCommand::
  ~cmCTestSetDirectoryPropertiesCommand((cmCTestSetDirectoryPropertiesCommand *)&testFilename);
  std::__cxx11::string::~string((string *)&local_2120);
  std::allocator<char>::~allocator(&local_2121);
  bVar2 = cmsys::SystemTools::FileExists("CTestTestfile.cmake");
  if (bVar2) {
    local_2160 = "CTestTestfile.cmake";
  }
  else {
    bVar2 = cmsys::SystemTools::FileExists("DartTestfile.txt");
    if (!bVar2) {
      this_local._7_1_ = true;
      goto LAB_001c2432;
    }
    local_2160 = "DartTestfile.txt";
  }
  pcVar5 = local_2160;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2188,pcVar5,(allocator<char> *)((long)&specFile.Value + 7));
  bVar2 = cmMakefile::ReadListFile((cmMakefile *)local_1f88,&local_2188);
  std::__cxx11::string::~string((string *)&local_2188);
  std::allocator<char>::~allocator((allocator<char> *)((long)&specFile.Value + 7));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    bVar2 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_21b8,"CTEST_RESOURCE_SPEC_FILE",&local_21b9);
      local_2198 = cmMakefile::GetDefinition((cmMakefile *)local_1f88,&local_21b8);
      std::__cxx11::string::~string((string *)&local_21b8);
      std::allocator<char>::~allocator(&local_21b9);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        bVar2 = cmValue::operator_cast_to_bool(&local_2198);
        if (bVar2) {
          psVar6 = cmValue::operator*[abi_cxx11_(&local_2198);
          std::__cxx11::string::operator=((string *)&this->ResourceSpecFile,(string *)psVar6);
        }
      }
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        ReadTestListFile(&local_21f8,this,&this->TestListFile);
        std::
        optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=(&this->TestsToRunByName,&local_21f8);
        std::
        optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~optional(&local_21f8);
        bVar2 = std::optional::operator_cast_to_bool((optional *)&this->TestsToRunByName);
        if (!bVar2) {
          this_local._7_1_ = false;
          goto LAB_001c2432;
        }
      }
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        ReadTestListFile(&local_2230,this,&this->ExcludeTestListFile);
        std::
        optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator=(&this->TestsToExcludeByName,&local_2230);
        std::
        optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~optional(&local_2230);
        bVar2 = std::optional::operator_cast_to_bool((optional *)&this->TestsToExcludeByName);
        if (!bVar2) {
          this_local._7_1_ = false;
          goto LAB_001c2432;
        }
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_23a8);
      poVar4 = std::operator<<((ostream *)local_23a8,"Done constructing a list of tests");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x755,pcVar5,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_23c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_23a8);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_001c2432:
  local_2164 = 1;
  cmMakefile::~cmMakefile((cmMakefile *)local_1f88);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&mf.IsSourceFileTryCompile);
  cmake::~cmake((cmake *)local_a68);
  return this_local._7_1_;
}

Assistant:

bool cmCTestTestHandler::GetListOfTests()
{
  if (!this->IncludeRegExp.empty()) {
    this->IncludeTestsRegularExpression.compile(this->IncludeRegExp);
  }
  if (!this->ExcludeRegExp.empty()) {
    this->ExcludeTestsRegularExpression.compile(this->ExcludeRegExp);
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Constructing a list of tests" << std::endl, this->Quiet);
  cmake cm(cmake::RoleScript, cmState::CTest);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  mf.AddDefinition("CTEST_CONFIGURATION_TYPE", this->CTest->GetConfigType());

  // Add handler for ADD_TEST
  cm.GetState()->AddBuiltinCommand("add_test", cmCTestAddTestCommand(this));

  // Add handler for SUBDIRS
  cm.GetState()->AddBuiltinCommand("subdirs", cmCTestSubdirCommand);

  // Add handler for ADD_SUBDIRECTORY
  cm.GetState()->AddBuiltinCommand("add_subdirectory",
                                   cmCTestAddSubdirectoryCommand);

  // Add handler for SET_TESTS_PROPERTIES
  cm.GetState()->AddBuiltinCommand("set_tests_properties",
                                   cmCTestSetTestsPropertiesCommand(this));

  // Add handler for SET_DIRECTORY_PROPERTIES
  cm.GetState()->RemoveBuiltinCommand("set_directory_properties");
  cm.GetState()->AddBuiltinCommand("set_directory_properties",
                                   cmCTestSetDirectoryPropertiesCommand(this));

  const char* testFilename;
  if (cmSystemTools::FileExists("CTestTestfile.cmake")) {
    // does the CTestTestfile.cmake exist ?
    testFilename = "CTestTestfile.cmake";
  } else if (cmSystemTools::FileExists("DartTestfile.txt")) {
    // does the DartTestfile.txt exist ?
    testFilename = "DartTestfile.txt";
  } else {
    return true;
  }

  if (!mf.ReadListFile(testFilename)) {
    return false;
  }
  if (cmSystemTools::GetErrorOccurredFlag()) {
    // SEND_ERROR or FATAL_ERROR in CTestTestfile or TEST_INCLUDE_FILES
    return false;
  }
  cmValue specFile = mf.GetDefinition("CTEST_RESOURCE_SPEC_FILE");
  if (this->ResourceSpecFile.empty() && specFile) {
    this->ResourceSpecFile = *specFile;
  }

  if (!this->TestListFile.empty()) {
    this->TestsToRunByName = this->ReadTestListFile(this->TestListFile);
    if (!this->TestsToRunByName) {
      return false;
    }
  }
  if (!this->ExcludeTestListFile.empty()) {
    this->TestsToExcludeByName =
      this->ReadTestListFile(this->ExcludeTestListFile);
    if (!this->TestsToExcludeByName) {
      return false;
    }
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Done constructing a list of tests" << std::endl,
                     this->Quiet);
  return true;
}